

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O2

REF_STATUS
ref_collapse_edge_same_normal(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  int iVar1;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ pRVar2;
  REF_INT *pRVar3;
  REF_ADJ_ITEM pRVar4;
  uint uVar5;
  long lVar6;
  undefined8 uVar7;
  ulong uVar8;
  REF_INT cell;
  char *pcVar9;
  REF_BOOL supported;
  REF_BOOL *local_f8;
  REF_GEOM local_f0;
  REF_DBL n1 [3];
  REF_DBL n0 [3];
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  local_f0 = ref_grid->geom;
  *allowed = 1;
  uVar8 = 0xffffffff;
  cell = -1;
  local_f8 = allowed;
  if (-1 < node1) {
    pRVar2 = ref_cell->ref_adj;
    uVar8 = 0xffffffff;
    cell = -1;
    if (node1 < pRVar2->nnode) {
      uVar5 = pRVar2->first[(uint)node1];
      uVar8 = 0xffffffff;
      cell = -1;
      if ((long)(int)uVar5 != -1) {
        cell = pRVar2->item[(int)uVar5].ref;
        uVar8 = (ulong)uVar5;
      }
    }
  }
  do {
    if ((int)uVar8 == -1) {
      return 0;
    }
    pRVar3 = ref_cell->c2n;
    lVar6 = (long)cell * (long)ref_cell->size_per;
    if (((pRVar3[lVar6] != node0) && (pRVar3[lVar6 + 1] != node0)) && (pRVar3[lVar6 + 2] != node0))
    {
      uVar5 = ref_cell_nodes(ref_cell,cell,nodes);
      if (uVar5 != 0) {
        pcVar9 = "nodes";
        uVar7 = 0x298;
LAB_0019eee4:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               uVar7,"ref_collapse_edge_same_normal",(ulong)uVar5,pcVar9);
        return uVar5;
      }
      uVar5 = ref_geom_tri_supported(local_f0,nodes,&supported);
      if (uVar5 != 0) {
        pcVar9 = "tri support";
        uVar7 = 0x29a;
        goto LAB_0019eee4;
      }
      if (supported == 0) {
        uVar5 = ref_node_tri_normal(ref_node,nodes,n0);
        if (uVar5 != 0) {
          pcVar9 = "orig normal";
          uVar7 = 0x29d;
          goto LAB_0019eee4;
        }
        uVar5 = ref_math_normalize(n0);
        if (uVar5 != 0) {
          pcVar9 = "original triangle has zero area";
          uVar7 = 0x29e;
          goto LAB_0019eee4;
        }
        iVar1 = ref_cell->node_per;
        for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
          if (nodes[lVar6] == node1) {
            nodes[lVar6] = node0;
          }
        }
        uVar5 = ref_node_tri_normal(ref_node,nodes,n1);
        if (uVar5 != 0) {
          pcVar9 = "new normal";
          uVar7 = 0x2a4;
          goto LAB_0019eee4;
        }
        uVar5 = ref_math_normalize(n1);
        if (uVar5 != 0) {
          if (uVar5 != 4) {
            pcVar9 = "new normal length";
            uVar7 = 0x2aa;
            goto LAB_0019eee4;
          }
LAB_0019ee42:
          *local_f8 = 0;
          return 0;
        }
        if (n0[2] * n1[2] + n0[0] * n1[0] + n0[1] * n1[1] < ref_node->same_normal_tol)
        goto LAB_0019ee42;
      }
    }
    pRVar4 = ref_cell->ref_adj->item;
    uVar8 = (ulong)pRVar4[(int)uVar8].next;
    cell = -1;
    if (uVar8 != 0xffffffffffffffff) {
      cell = pRVar4[uVar8].ref;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_same_normal(REF_GRID ref_grid,
                                                 REF_INT node0, REF_INT node1,
                                                 REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell, node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL n0[3], n1[3];
  REF_DBL dot;
  REF_STATUS status;
  REF_BOOL supported;

  *allowed = REF_TRUE;

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    /* a triangle with node0 and node1 will be removed */
    if (node0 == ref_cell_c2n(ref_cell, 0, cell) ||
        node0 == ref_cell_c2n(ref_cell, 1, cell) ||
        node0 == ref_cell_c2n(ref_cell, 2, cell))
      continue;
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    RSS(ref_geom_tri_supported(ref_geom, nodes, &supported), "tri support");
    if (supported) continue; /* geom support, checked by normdev */

    RSS(ref_node_tri_normal(ref_node, nodes, n0), "orig normal");
    RSS(ref_math_normalize(n0), "original triangle has zero area");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node1 == nodes[node]) {
        nodes[node] = node0;
      }
    }
    RSS(ref_node_tri_normal(ref_node, nodes, n1), "new normal");
    status = ref_math_normalize(n1);
    if (REF_DIV_ZERO == status) { /* new triangle face has zero area */
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    RSS(status, "new normal length")
    dot = ref_math_dot(n0, n1);
    if (dot < ref_node_same_normal_tol(ref_node)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  return REF_SUCCESS;
}